

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineBspline.cpp
# Opt level: O2

void __thiscall
chrono::geometry::ChLineBspline::Derive(ChLineBspline *this,ChVector<double> *dir,double parU)

{
  double *pdVar1;
  pointer pCVar2;
  int i;
  int iVar3;
  Scalar *pSVar4;
  long lVar5;
  long col;
  double dVar6;
  int local_6c;
  ChVector<double> v;
  ChMatrixDynamic<> NdN;
  
  if (this->closed == true) {
    parU = fmod(parU,1.0);
  }
  dVar6 = ComputeKnotUfromU(this,parU);
  i = ChBasisToolsBspline::FindSpan(this->p,dVar6,&this->knots);
  v.m_data[0] = (double)CONCAT44(v.m_data[0]._4_4_,2);
  local_6c = this->p + 1;
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,1,_1,_1> *)&NdN,(int *)&v,&local_6c);
  ChBasisToolsBspline::BasisEvaluateDeriv(this->p,i,dVar6,&this->knots,&NdN);
  if (dir != (ChVector<double> *)&VNULL) {
    dir->m_data[0] = VNULL;
    dir->m_data[1] = DAT_011dd3e0;
    dir->m_data[2] = DAT_011dd3e8;
  }
  iVar3 = this->p;
  lVar5 = (long)(i - iVar3) * 0x18 + 0x10;
  for (col = 0; col <= iVar3; col = col + 1) {
    pCVar2 = (this->points).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&NdN,1,col);
    dVar6 = *pSVar4;
    pdVar1 = (double *)((long)pCVar2->m_data + lVar5 + -0x10);
    v.m_data[0] = dVar6 * *pdVar1;
    v.m_data[1] = dVar6 * pdVar1[1];
    v.m_data[2] = dVar6 * *(double *)((long)pCVar2->m_data + lVar5);
    ChVector<double>::operator+=(dir,&v);
    iVar3 = this->p;
    lVar5 = lVar5 + 0x18;
  }
  Eigen::internal::handmade_aligned_free
            (NdN.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data);
  return;
}

Assistant:

void ChLineBspline::Derive(ChVector<>& dir, const double parU) const {
	double mU;
	if (this->closed)
		mU = fmod(parU, 1.0);
	else
		mU = parU;

    double u = ComputeKnotUfromU(mU);

    int spanU = ChBasisToolsBspline::FindSpan(this->p, u, this->knots);

    ChMatrixDynamic<> NdN(2, p + 1);  // basis on 1st row and their 1st derivatives on 2nd row
    ChBasisToolsBspline::BasisEvaluateDeriv(this->p, spanU, u, this->knots, NdN);

    dir = VNULL;
    int uind = spanU - p;
    for (int i = 0; i <= this->p; i++) {
        dir += points[uind + i] * NdN(1, i);
    }
}